

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ip6.cpp
# Opt level: O0

void __thiscall clickhouse::ColumnIPv6::Append(ColumnIPv6 *this,ColumnRef *column)

{
  bool bVar1;
  element_type *this_00;
  Column *in_RDI;
  shared_ptr<clickhouse::ColumnIPv6> col;
  shared_ptr<clickhouse::ColumnFixedString> *in_stack_ffffffffffffff98;
  undefined1 local_30 [16];
  __shared_ptr local_20 [32];
  
  std::__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
            ((__shared_ptr_access<clickhouse::Column,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             0x21130a);
  Column::As<clickhouse::ColumnIPv6>(in_RDI);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(local_20);
  if (bVar1) {
    this_00 = std::
              __shared_ptr_access<clickhouse::ColumnFixedString,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<clickhouse::ColumnFixedString,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x211335);
    std::__shared_ptr_access<clickhouse::ColumnIPv6,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<clickhouse::ColumnIPv6,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x211344);
    std::shared_ptr<clickhouse::Column>::shared_ptr<clickhouse::ColumnFixedString,void>
              ((shared_ptr<clickhouse::Column> *)this_00,in_stack_ffffffffffffff98);
    (*(this_00->super_Column)._vptr_Column[2])(this_00,local_30);
    std::shared_ptr<clickhouse::Column>::~shared_ptr((shared_ptr<clickhouse::Column> *)0x211379);
  }
  std::shared_ptr<clickhouse::ColumnIPv6>::~shared_ptr
            ((shared_ptr<clickhouse::ColumnIPv6> *)0x2113a9);
  return;
}

Assistant:

void ColumnIPv6::Append(ColumnRef column) {
    if (auto col = column->As<ColumnIPv6>()) {
        data_->Append(col->data_);
    }
}